

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalReturnAlways(ShaderEvalContext *c)

{
  Vector<float,_3> local_28;
  VecAccess<float,_4,_3> local_18;
  
  local_28.m_data[2] = (c->coords).m_data[2];
  local_28.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  local_18.m_vector = &c->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_28);
  return;
}

Assistant:

inline void evalReturnAlways	(ShaderEvalContext& c) { c.color.xyz() = c.coords.swizzle(0,1,2); }